

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecWec.h
# Opt level: O2

void Vec_WecFree(Vec_Wec_t *p)

{
  void *__ptr;
  Vec_Int_t *__ptr_00;
  long lVar1;
  long lVar2;
  
  __ptr_00 = p->pArray;
  lVar1 = 8;
  for (lVar2 = 0; lVar2 < p->nCap; lVar2 = lVar2 + 1) {
    __ptr = *(void **)((long)&__ptr_00->nCap + lVar1);
    if (__ptr != (void *)0x0) {
      free(__ptr);
      __ptr_00 = p->pArray;
      *(undefined8 *)((long)&__ptr_00->nCap + lVar1) = 0;
    }
    lVar1 = lVar1 + 0x10;
  }
  free(__ptr_00);
  free(p);
  return;
}

Assistant:

static inline void Vec_WecFree( Vec_Wec_t * p )
{
    Vec_WecErase( p );
    ABC_FREE( p );
}